

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

Vec_Int_t * Saig_ManFindIsoPermCos(Aig_Man_t *pAig,Vec_Int_t *vPermCis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pObj_00;
  Vec_Ptr_t *vRoots;
  int Diff;
  int Entry;
  int i;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObj;
  Vec_Int_t *vPermCos;
  Vec_Int_t *vPermCis_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Vec_IntSize(vPermCis);
  iVar2 = Aig_ManCiNum(pAig);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vPermCis) == Aig_ManCiNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigIso.c"
                  ,0x34,"Vec_Int_t *Saig_ManFindIsoPermCos(Aig_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Aig_ManCoNum(pAig);
  p = Vec_IntAlloc(iVar1);
  iVar1 = Saig_ManPoNum(pAig);
  if (iVar1 == 1) {
    Vec_IntPush(p,0);
  }
  else {
    iVar1 = Saig_ManPoNum(pAig);
    p_00 = Vec_PtrAlloc(iVar1);
    for (Diff = 0; iVar1 = Saig_ManPoNum(pAig), Diff < iVar1; Diff = Diff + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,Diff);
      pObj_00 = Aig_ObjFanin0(pAVar4);
      iVar1 = Aig_ObjIsConst1(pObj_00);
      if ((iVar1 == 0) && ((pObj_00->field_5).iData < 1)) {
        __assert_fail("Aig_ObjIsConst1(pFanin) || pFanin->iData > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigIso.c"
                      ,0x3e,"Vec_Int_t *Saig_ManFindIsoPermCos(Aig_Man_t *, Vec_Int_t *)");
      }
      iVar1 = (pObj_00->field_5).iData;
      iVar2 = Aig_ObjFaninC0(pAVar4);
      iVar1 = Abc_Var2Lit(iVar1,iVar2);
      (pAVar4->field_5).iData = iVar1;
      Vec_PtrPush(p_00,pAVar4);
    }
    Vec_PtrSort(p_00,Iso_ObjCompareByData);
    for (Diff = 0; iVar1 = Vec_PtrSize(p_00), Diff < iVar1; Diff = Diff + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,Diff);
      iVar1 = Aig_ObjCioId(pAVar4);
      Vec_IntPush(p,iVar1);
    }
    Vec_PtrFree(p_00);
  }
  iVar1 = Saig_ManPoNum(pAig);
  iVar2 = Saig_ManPiNum(pAig);
  for (Diff = Saig_ManPiNum(pAig); iVar3 = Vec_IntSize(vPermCis), Diff < iVar3; Diff = Diff + 1) {
    iVar3 = Vec_IntEntry(vPermCis,Diff);
    Vec_IntPush(p,iVar3 + (iVar1 - iVar2));
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the canonical permutation of the COs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Saig_ManFindIsoPermCos( Aig_Man_t * pAig, Vec_Int_t * vPermCis )
{
    extern int Iso_ObjCompareByData( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 );
    Vec_Int_t * vPermCos;
    Aig_Obj_t * pObj, * pFanin;
    int i, Entry, Diff;
    assert( Vec_IntSize(vPermCis) == Aig_ManCiNum(pAig) );
    vPermCos = Vec_IntAlloc( Aig_ManCoNum(pAig) );
    if ( Saig_ManPoNum(pAig) == 1 )
        Vec_IntPush( vPermCos, 0 );
    else
    {
        Vec_Ptr_t * vRoots = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
        Saig_ManForEachPo( pAig, pObj, i )
        {
            pFanin = Aig_ObjFanin0(pObj);
            assert( Aig_ObjIsConst1(pFanin) || pFanin->iData > 0 );
            pObj->iData = Abc_Var2Lit( pFanin->iData, Aig_ObjFaninC0(pObj) );
            Vec_PtrPush( vRoots, pObj );
        }
        Vec_PtrSort( vRoots, (int (*)(void))Iso_ObjCompareByData );
        Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
            Vec_IntPush( vPermCos, Aig_ObjCioId(pObj) );
        Vec_PtrFree( vRoots );
    }
    // add flop outputs
    Diff = Saig_ManPoNum(pAig) - Saig_ManPiNum(pAig);
    Vec_IntForEachEntryStart( vPermCis, Entry, i, Saig_ManPiNum(pAig) )
        Vec_IntPush( vPermCos, Entry + Diff );
    return vPermCos;
}